

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O1

int __thiscall
Centaurus::Grammar<wchar_t>::verify
          (Grammar<wchar_t> *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  long *plVar1;
  bool bVar2;
  wostream *pwVar3;
  undefined7 extraout_var;
  int iVar4;
  __node_base *p_Var5;
  CompositeATN<wchar_t> local_68;
  
  p_Var5 = &(this->m_networks)._M_h._M_before_begin;
  do {
    p_Var5 = p_Var5->_M_nxt;
    if (p_Var5 == (__node_base *)0x0) goto LAB_00157f78;
    bVar2 = ATNMachine<wchar_t>::verify_invocations
                      ((ATNMachine<wchar_t> *)(p_Var5 + 6),&this->m_networks);
  } while (bVar2);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
            ((wostream *)&std::wcerr,L"Nonterminal invocation check failed at ",0x27);
  pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     ((wostream *)&std::wcerr,
                      (wchar_t *)
                      *(_Hash_node_base **)
                       &((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor,
                      (long)p_Var5[3]._M_nxt);
  plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
  if (plVar1 == (long *)0x0) {
    std::__throw_bad_cast();
  }
  (**(code **)(*plVar1 + 0x50))(plVar1,10);
  std::wostream::put((wchar_t)pwVar3);
  std::wostream::flush();
  if (p_Var5 == (__node_base *)0x0) {
LAB_00157f78:
    CompositeATN<wchar_t>::CompositeATN(&local_68,this);
    bVar2 = CompositeATN<wchar_t>::verify_decisions(&local_68,&this->m_networks);
    iVar4 = (int)CONCAT71(extraout_var,bVar2);
    local_68._vptr_CompositeATN = (_func_int **)&PTR__CompositeATN_001ca300;
    std::
    _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68.m_dict._M_h);
  }
  else {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

bool Grammar<TCHAR>::verify() const
{
    for (const auto& p : m_networks)
    {
        if (!p.second.verify_invocations(m_networks))
        {
            std::wcerr << L"Nonterminal invocation check failed at " << p.first << std::endl;
            return false;
        }
    }

    if (!CompositeATN<TCHAR>(*this).verify_decisions(m_networks))
    {
        return false;
    }

    return true;
}